

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O1

xxh_u64 XXH64_finalize(xxh_u64 h64,xxh_u8 *ptr,size_t len,XXH_alignment align)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  for (uVar1 = (ulong)((uint)len & 0x1f); 7 < uVar1; uVar1 = uVar1 - 8) {
    uVar2 = (*(long *)ptr * -0x6c158a5880000000 |
            (ulong)(*(long *)ptr * -0x3d4d51c2d82b14b1) >> 0x21) * -0x61c8864e7a143579 ^ h64;
    ptr = (xxh_u8 *)((long)ptr + 8);
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  }
  if (3 < uVar1) {
    uVar2 = (ulong)*(uint *)ptr * -0x61c8864e7a143579 ^ h64;
    ptr = (xxh_u8 *)((long)ptr + 4);
    h64 = (uVar2 << 0x17 | uVar2 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    uVar1 = uVar1 - 4;
  }
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      uVar3 = (ulong)*(byte *)((long)ptr + uVar2) * 0x27d4eb2f165667c5 ^ h64;
      h64 = (uVar3 << 0xb | uVar3 >> 0x35) * -0x61c8864e7a143579;
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  uVar1 = (h64 >> 0x21 ^ h64) * -0x3d4d51c2d82b14b1;
  uVar1 = (uVar1 >> 0x1d ^ uVar1) * 0x165667b19e3779f9;
  return uVar1 >> 0x20 ^ uVar1;
}

Assistant:

static xxh_u64 XXH64_finalize(xxh_u64 h64, const xxh_u8* ptr, size_t len,
                              XXH_alignment align) {
#define XXH_PROCESS1_64                        \
  do {                                         \
    h64 ^= (*ptr++) * XXH_PRIME64_5;           \
    h64 = XXH_rotl64(h64, 11) * XXH_PRIME64_1; \
  } while (0)

#define XXH_PROCESS4_64                                        \
  do {                                                         \
    h64 ^= (xxh_u64)(XXH_get32bits(ptr)) * XXH_PRIME64_1;      \
    ptr += 4;                                                  \
    h64 = XXH_rotl64(h64, 23) * XXH_PRIME64_2 + XXH_PRIME64_3; \
  } while (0)

#define XXH_PROCESS8_64                                        \
  do {                                                         \
    xxh_u64 const k1 = XXH64_round(0, XXH_get64bits(ptr));     \
    ptr += 8;                                                  \
    h64 ^= k1;                                                 \
    h64 = XXH_rotl64(h64, 27) * XXH_PRIME64_1 + XXH_PRIME64_4; \
  } while (0)

  /* Rerolled version for 32-bit targets is faster and much smaller. */
  if (XXH_REROLL || XXH_REROLL_XXH64) {
    len &= 31;
    while (len >= 8) {
      XXH_PROCESS8_64;
      len -= 8;
    }
    if (len >= 4) {
      XXH_PROCESS4_64;
      len -= 4;
    }
    while (len > 0) {
      XXH_PROCESS1_64;
      --len;
    }
    return XXH64_avalanche(h64);
  } else {
    switch (len & 31) {
      case 24:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 16:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 8:
        XXH_PROCESS8_64;
        return XXH64_avalanche(h64);

      case 28:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 20:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 12:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 4:
        XXH_PROCESS4_64;
        return XXH64_avalanche(h64);

      case 25:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 17:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 9:
        XXH_PROCESS8_64;
        XXH_PROCESS1_64;
        return XXH64_avalanche(h64);

      case 29:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 21:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 13:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 5:
        XXH_PROCESS4_64;
        XXH_PROCESS1_64;
        return XXH64_avalanche(h64);

      case 26:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 18:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 10:
        XXH_PROCESS8_64;
        XXH_PROCESS1_64;
        XXH_PROCESS1_64;
        return XXH64_avalanche(h64);

      case 30:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 22:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 14:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 6:
        XXH_PROCESS4_64;
        XXH_PROCESS1_64;
        XXH_PROCESS1_64;
        return XXH64_avalanche(h64);

      case 27:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 19:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 11:
        XXH_PROCESS8_64;
        XXH_PROCESS1_64;
        XXH_PROCESS1_64;
        XXH_PROCESS1_64;
        return XXH64_avalanche(h64);

      case 31:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 23:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 15:
        XXH_PROCESS8_64;
        /* fallthrough */
      case 7:
        XXH_PROCESS4_64;
        /* fallthrough */
      case 3:
        XXH_PROCESS1_64;
        /* fallthrough */
      case 2:
        XXH_PROCESS1_64;
        /* fallthrough */
      case 1:
        XXH_PROCESS1_64;
        /* fallthrough */
      case 0:
        return XXH64_avalanche(h64);
    }
  }
  /* impossible to reach */
  XXH_ASSERT(0);
  return 0; /* unreachable, but some compilers complain without it */
}